

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O2

bool __thiscall trento::MinDistNucleus::is_too_close(MinDistNucleus *this,const_iterator nucleon)

{
  double *pdVar1;
  bool bVar2;
  double dVar3;
  double *pdVar4;
  NucleonData *pNVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (this->dminsq_ < 1e-10) {
    return false;
  }
  pNVar5 = (this->super_Nucleus).nucleons_.
           super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    bVar2 = pNVar5 != nucleon._M_current;
    if (pNVar5 == nucleon._M_current) {
      return bVar2;
    }
    dVar3 = (nucleon._M_current)->y_ - pNVar5->y_;
    pdVar4 = &pNVar5->x_;
    pdVar1 = &pNVar5->z_;
    pNVar5 = pNVar5 + 1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (nucleon._M_current)->x_ - *pdVar4;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar3 * dVar3;
    auVar6 = vfmadd231sd_fma(auVar7,auVar6,auVar6);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (nucleon._M_current)->z_ - *pdVar1;
    auVar6 = vfmadd231sd_fma(auVar6,auVar8,auVar8);
  } while (this->dminsq_ <= auVar6._0_8_);
  return bVar2;
}

Assistant:

bool MinDistNucleus::is_too_close(const_iterator nucleon) const {
  if (dminsq_ < 1e-10)
    return false;
  for (const_iterator nucleon2 = begin(); nucleon2 != nucleon; ++nucleon2) {
    auto dx = nucleon->x() - nucleon2->x();
    auto dy = nucleon->y() - nucleon2->y();
    auto dz = nucleon->z() - nucleon2->z();
    if (dx*dx + dy*dy + dz*dz < dminsq_)
      return true;
  }
  return false;
}